

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall toml::bad_result_access::~bad_result_access(bad_result_access *this)

{
  ~bad_result_access(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~bad_result_access() noexcept override = default;